

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

string * __thiscall
CMU462::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  
  psVar1 = (string *)
           (*(code *)(&DAT_001e4e70 +
                     *(int *)(&DAT_001e4e70 + (ulong)*(uint *)&(this->super_Renderer).field_0xc * 4)
                     ))();
  return psVar1;
}

Assistant:

string Application::info() {
  switch (mode) {
    case MODEL_MODE:
      return "MeshEdit";
      break;
    case ANIMATE_MODE:
      return "Animation";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "PathTracer";
      break;
  }
}